

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

int rops_close_kill_connection_ws(lws *wsi,lws_close_status reason)

{
  lws_close_status reason_local;
  lws *wsi_local;
  
  if (((*(ulong *)&wsi->field_0x2dc >> 1 & 1) == 0) || ((*(ulong *)&wsi->field_0x2dc >> 4 & 1) == 0)
     ) {
    wsi_local._4_4_ = 0;
  }
  else {
    wsi_local._4_4_ = rops_close_kill_connection_h2(wsi,reason);
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_close_kill_connection_ws(struct lws *wsi, enum lws_close_status reason)
{
	/* deal with ws encapsulation in h2 */
#if defined(LWS_WITH_HTTP2)
	if (wsi->mux_substream && wsi->h2_stream_carries_ws)
		return role_ops_h2.close_kill_connection(wsi, reason);

	return 0;
#else
	return 0;
#endif
}